

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall
QPDFArgParser::getTopicHelp(QPDFArgParser *this,string *name,HelpTopic *ht,ostringstream *msg)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  reference __k;
  element_type *peVar4;
  mapped_type *pmVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  ostringstream *msg_local;
  HelpTopic *ht_local;
  string *name_local;
  QPDFArgParser *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator<<((ostream *)msg,(string *)&ht->long_text);
  }
  else {
    poVar3 = std::operator<<((ostream *)msg,(string *)ht);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&ht->options);
  if (!bVar1) {
    poVar3 = (ostream *)std::ostream::operator<<(msg,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Related options:");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&ht->options);
    i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&ht->options);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&i), bVar1) {
      __k = std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&__end2);
      poVar3 = std::operator<<((ostream *)msg,"  ");
      poVar3 = std::operator<<(poVar3,(string *)__k);
      poVar3 = std::operator<<(poVar3,": ");
      peVar4 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
               ::operator[](&peVar4->option_help,__k);
      poVar3 = std::operator<<(poVar3,(string *)pmVar5);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void
QPDFArgParser::getTopicHelp(std::string const& name, HelpTopic const& ht, std::ostringstream& msg)
{
    if (ht.long_text.empty()) {
        msg << ht.short_text << std::endl;
    } else {
        msg << ht.long_text;
    }
    if (!ht.options.empty()) {
        msg << std::endl << "Related options:" << std::endl;
        for (auto const& i: ht.options) {
            msg << "  " << i << ": " << m->option_help[i].short_text << std::endl;
        }
    }
}